

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

bool google::protobuf::internal::anon_unknown_50::ParseEndsInSlopRegion
               (char *begin,int overrun,int depth)

{
  uint32_t uVar1;
  LogMessage *pLVar2;
  int32_t size;
  uint64_t val;
  char *pcStack_c8;
  uint32_t tag;
  char *end;
  char *ptr;
  LogMessage local_b0;
  LogFinisher local_75 [20];
  byte local_61;
  LogMessage local_60;
  undefined4 local_24;
  int local_20;
  int kSlopBytes;
  int depth_local;
  int overrun_local;
  char *begin_local;
  
  local_24 = 0x10;
  local_61 = 0;
  local_20 = depth;
  kSlopBytes = overrun;
  _depth_local = begin;
  if (overrun < 0) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.cc"
               ,0x35);
    local_61 = 1;
    pLVar2 = LogMessage::operator<<(&local_60,"CHECK failed: overrun >= 0: ");
    LogFinisher::operator=(local_75,pLVar2);
  }
  if ((local_61 & 1) != 0) {
    LogMessage::~LogMessage(&local_60);
  }
  ptr._7_1_ = 0;
  if (0x10 < kSlopBytes) {
    LogMessage::LogMessage
              (&local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.cc"
               ,0x36);
    ptr._7_1_ = 1;
    pLVar2 = LogMessage::operator<<(&local_b0,"CHECK failed: overrun <= kSlopBytes: ");
    LogFinisher::operator=((LogFinisher *)((long)&ptr + 6),pLVar2);
  }
  if ((ptr._7_1_ & 1) != 0) {
    LogMessage::~LogMessage(&local_b0);
  }
  end = _depth_local + kSlopBytes;
  pcStack_c8 = _depth_local + 0x10;
  while( true ) {
    if (pcStack_c8 <= end) {
      return false;
    }
    end = ReadTag(end,(uint32_t *)((long)&val + 4),0);
    if ((end == (char *)0x0) || (pcStack_c8 < end)) break;
    if (val._4_4_ == 0) {
      return true;
    }
    switch(val._4_4_ & 7) {
    case 0:
      end = VarintParse<unsigned_long>(end,(unsigned_long *)&stack0xffffffffffffff28);
      if (end == (char *)0x0) {
        return false;
      }
      break;
    case 1:
      end = end + 8;
      break;
    case 2:
      uVar1 = ReadSize(&end);
      if ((end == (char *)0x0) || ((long)pcStack_c8 - (long)end < (long)(int)uVar1)) {
        return false;
      }
      end = end + (int)uVar1;
      break;
    case 3:
      local_20 = local_20 + 1;
      break;
    case 4:
      local_20 = local_20 + -1;
      if (local_20 < 0) {
        return true;
      }
      break;
    case 5:
      end = end + 4;
      break;
    default:
      return false;
    }
  }
  return false;
}

Assistant:

bool ParseEndsInSlopRegion(const char* begin, int overrun, int depth) {
  constexpr int kSlopBytes = EpsCopyInputStream::kSlopBytes;
  GOOGLE_DCHECK(overrun >= 0);
  GOOGLE_DCHECK(overrun <= kSlopBytes);
  auto ptr = begin + overrun;
  auto end = begin + kSlopBytes;
  while (ptr < end) {
    uint32_t tag;
    ptr = ReadTag(ptr, &tag);
    if (ptr == nullptr || ptr > end) return false;
    // ending on 0 tag is allowed and is the major reason for the necessity of
    // this function.
    if (tag == 0) return true;
    switch (tag & 7) {
      case 0: {  // Varint
        uint64_t val;
        ptr = VarintParse(ptr, &val);
        if (ptr == nullptr) return false;
        break;
      }
      case 1: {  // fixed64
        ptr += 8;
        break;
      }
      case 2: {  // len delim
        int32_t size = ReadSize(&ptr);
        if (ptr == nullptr || size > end - ptr) return false;
        ptr += size;
        break;
      }
      case 3: {  // start group
        depth++;
        break;
      }
      case 4: {                    // end group
        if (--depth < 0) return true;  // We exit early
        break;
      }
      case 5: {  // fixed32
        ptr += 4;
        break;
      }
      default:
        return false;  // Unknown wireformat
    }
  }
  return false;
}